

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QThread::exit(QThread *this,int __status)

{
  qsizetype *this_00;
  long lVar1;
  void *copy;
  QObjectData *pQVar2;
  QObject *pQVar3;
  _func_int **pp_Var4;
  
  pQVar2 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar2[1].children.d.size;
  if (pQVar2[1].children.d.size == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 == 0) goto LAB_0034758a;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_0034758a:
  *(undefined1 *)
   ((long)&pQVar2[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1) = 1;
  *(int *)((long)&pQVar2[1].metaObject + 4) = __status;
  pQVar3 = pQVar2[2].q_ptr;
  *(undefined1 *)((long)&pQVar3[8].d_ptr.d + 4) = 1;
  if (pQVar3[1]._vptr_QObject != (_func_int **)0x0) {
    pp_Var4 = (_func_int **)0x0;
    do {
      QEventLoop::exit((QEventLoop *)(&((pQVar3->d_ptr).d)->_vptr_QObjectData)[(long)pp_Var4],
                       __status);
      pp_Var4 = (_func_int **)((long)pp_Var4 + 1);
      pQVar3 = pQVar2[2].q_ptr;
    } while (pp_Var4 < pQVar3[1]._vptr_QObject);
  }
  LOCK();
  copy = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    return;
  }
  return;
}

Assistant:

void QThread::exit(int returnCode)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    d->exited = true;
    d->returnCode = returnCode;
    d->data->quitNow = true;
    for (int i = 0; i < d->data->eventLoops.size(); ++i) {
        QEventLoop *eventLoop = d->data->eventLoops.at(i);
        eventLoop->exit(returnCode);
    }
}